

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O2

fdb_status fdb_shutdown(void)

{
  fdb_status fVar1;
  
  if (fdb_initialized.super___atomic_base<unsigned_char>._M_i == '\0') {
    fVar1 = FDB_RESULT_SUCCESS;
  }
  else {
    pthread_spin_lock(&initial_lock);
    if (fdb_initialized.super___atomic_base<unsigned_char>._M_i == '\0') {
      fVar1 = FDB_RESULT_SUCCESS;
    }
    else if (fdb_open_inprog == 0) {
      compactor_shutdown();
      fVar1 = filemgr_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fVar1 = FDB_RESULT_SUCCESS;
        LOCK();
        fdb_initialized.super___atomic_base<unsigned_char>._M_i = (__atomic_base<unsigned_char>)'\0'
        ;
        UNLOCK();
      }
    }
    else {
      fVar1 = FDB_RESULT_FILE_IS_BUSY;
    }
    pthread_spin_unlock(&initial_lock);
  }
  return fVar1;
}

Assistant:

LIBFDB_API
fdb_status fdb_shutdown()
{
    fdb_status ret = FDB_RESULT_SUCCESS;
    if (fdb_initialized) {

#ifndef SPIN_INITIALIZER
        // Windows: check if spin lock is already destroyed.
        if (InterlockedCompareExchange(&initial_lock_status, 1, 2) == 2) {
            spin_lock(&initial_lock);
        } else {
            // ForestDB is already shut down
            return ret;
        }
#else
        spin_lock(&initial_lock);
#endif

        if (!fdb_initialized) {
            // ForestDB is already shut down
            spin_unlock(&initial_lock);
            return ret;
        }
        if (fdb_open_inprog) {
            spin_unlock(&initial_lock);
            return FDB_RESULT_FILE_IS_BUSY;
        }
        compactor_shutdown();
        //bgflusher_shutdown();
        ret = filemgr_shutdown();
        if (ret == FDB_RESULT_SUCCESS) {
#ifdef _MEMPOOL
            mempool_shutdown();
#endif
            fdb_initialized = 0;
            spin_unlock(&initial_lock);
#ifndef SPIN_INITIALIZER
            spin_destroy(&initial_lock);
            initial_lock_status = 0;
#endif
        } else { // some file may be still open...
            spin_unlock(&initial_lock);
        }
        //_dbg_destroy_altstack();
    }
    return ret;
}